

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::AllocateMemory
          (StandardBufferManager *this,MemoryTag tag,BlockManager *block_manager,bool can_destroy)

{
  undefined1 can_destroy_00;
  idx_t iVar1;
  idx_t iVar2;
  undefined7 in_register_00000009;
  long lVar4;
  shared_ptr<duckdb::BlockHandle,_true> sVar5;
  idx_t iVar3;
  
  lVar4 = CONCAT71(in_register_00000009,can_destroy);
  iVar1 = optional_idx::GetIndex((optional_idx *)(lVar4 + 0x78));
  iVar2 = optional_idx::GetIndex((optional_idx *)(lVar4 + 0x80));
  if (*(long *)(lVar4 + 0x80) == -1) {
    can_destroy_00 = 8;
  }
  else {
    iVar3 = optional_idx::GetIndex((optional_idx *)(lVar4 + 0x80));
    can_destroy_00 = (undefined1)iVar3;
  }
  sVar5 = RegisterMemory(this,tag,(ulong)block_manager & 0xff,iVar1 - iVar2,(bool)can_destroy_00);
  sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::AllocateMemory(MemoryTag tag, BlockManager *block_manager,
                                                              bool can_destroy) {
	return RegisterMemory(tag, block_manager->GetBlockSize(), block_manager->GetBlockHeaderSize(), can_destroy);
}